

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void qrhigl_accumulateComputeResource<QHash<QRhiResource*,std::pair<int,bool>>>
               (QHash<QRhiResource_*,_std::pair<int,_bool>_> *writtenResources,
               QRhiResource *resource,Type bindingType,int loadTypeVal,int storeTypeVal,
               int loadStoreTypeVal)

{
  bool bVar1;
  pair<int,_bool> *ppVar2;
  int in_ECX;
  int in_EDX;
  QHash<QRhiResource_*,_std::pair<int,_bool>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  iterator it;
  int access;
  QRhiResource **in_stack_ffffffffffffff78;
  iterator *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar3;
  bool local_41;
  piter local_40;
  piter local_30;
  uint local_1c [3];
  pair<int,_bool> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == in_ECX) {
    local_1c[0] = 1;
  }
  else {
    local_1c[0] = 2;
    if (in_EDX == in_R9D) {
      local_1c[0] = 3;
    }
  }
  local_30.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_30.d = (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)
               &DAT_aaaaaaaaaaaaaaaa;
  local_30 = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::find
                              ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)
                               in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_40 = (piter)QHash<QRhiResource_*,_std::pair<int,_bool>_>::end
                              ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = QHash<QRhiResource_*,_std::pair<int,_bool>_>::iterator::operator!=
                    ((iterator *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     in_stack_ffffffffffffff80);
  if (bVar1) {
    uVar3 = local_1c[0];
    ppVar2 = QHash<QRhiResource_*,_std::pair<int,_bool>_>::iterator::operator->
                       ((iterator *)0x938d0f);
    ppVar2->first = uVar3 | ppVar2->first;
  }
  else if ((in_EDX == in_R8D) || (in_EDX == in_R9D)) {
    local_41 = true;
    std::pair<int,_bool>::pair<int_&,_bool,_true>(&local_10,(int *)local_1c,&local_41);
    QHash<QRhiResource_*,_std::pair<int,_bool>_>::insert
              (in_RDI,in_stack_ffffffffffffff78,(pair<int,_bool> *)0x938d64);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void qrhigl_accumulateComputeResource(T *writtenResources, QRhiResource *resource,
                                             QRhiShaderResourceBinding::Type bindingType,
                                             int loadTypeVal, int storeTypeVal, int loadStoreTypeVal)
{
    int access = 0;
    if (bindingType == loadTypeVal) {
        access = QGles2CommandBuffer::ComputePassState::Read;
    } else {
        access = QGles2CommandBuffer::ComputePassState::Write;
        if (bindingType == loadStoreTypeVal)
            access |= QGles2CommandBuffer::ComputePassState::Read;
    }
    auto it = writtenResources->find(resource);
    if (it != writtenResources->end())
        it->first |= access;
    else if (bindingType == storeTypeVal || bindingType == loadStoreTypeVal)
        writtenResources->insert(resource, { access, true });
}